

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

int __thiscall QFormLayoutItem::vStretch(QFormLayoutItem *this)

{
  int iVar1;
  QSizePolicy QVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->item->_vptr_QLayoutItem[0xd])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    uVar3 = 0;
  }
  else {
    iVar1 = (*this->item->_vptr_QLayoutItem[0xd])();
    QVar2 = QWidget::sizePolicy((QWidget *)CONCAT44(extraout_var_00,iVar1));
    uVar3 = (uint)QVar2.field_0 >> 8 & 0xff;
  }
  return uVar3;
}

Assistant:

int vStretch() const { return widget() ? widget()->sizePolicy().verticalStretch() : 0; }